

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

gint tb_page_addr_cmp(gconstpointer ap,gconstpointer bp,gpointer udata)

{
  uint uVar1;
  
  uVar1 = -(uint)(*ap < *bp) | 1;
  if (*ap == *bp) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static gint tb_page_addr_cmp(gconstpointer ap, gconstpointer bp, gpointer udata)
{
    tb_page_addr_t a = *(const tb_page_addr_t *)ap;
    tb_page_addr_t b = *(const tb_page_addr_t *)bp;

    if (a == b) {
        return 0;
    } else if (a < b) {
        return -1;
    }
    return 1;
}